

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O2

void __thiscall CSocekt::flyd_close_connection(CSocekt *this,lp_connection_t pConn)

{
  flyd_free_connection(this,pConn);
  if (pConn->fd != -1) {
    close(pConn->fd);
    pConn->fd = -1;
  }
  return;
}

Assistant:

void CSocekt::flyd_close_connection(lp_connection_t pConn)
{
   
    flyd_free_connection(pConn);
   // c->fd = -1; //官方nginx这么写，但这有意义吗？
    if(pConn->fd != -1)
    {
        close(pConn->fd);
        pConn->fd = -1;
        //ngx_log_error_core(NGX_LOG_ALERT,errno,"CSocekt::ngx_close_accepted_connection()中close(%d)失败!",fd);
       // LOG_ERROR << "CSocekt::ngx_close_accepted_connection()中close(%d)失败!";
    }
    

}